

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O3

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               *src,assign_op<double,_double> *func)

{
  double *pdVar1;
  double dVar2;
  ulong cols;
  double *pdVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined8 *puVar6;
  Index index;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  undefined4 uVar11;
  
  dVar2 = (src->m_functor).m_other;
  uVar11 = (undefined4)((ulong)dVar2 >> 0x20);
  uVar8 = (src->m_rows).m_value;
  cols = (src->m_cols).m_value;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar8) ||
     (uVar5 = cols, uVar7 = uVar8,
     (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
     cols)) {
    if ((long)(cols | uVar8) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((cols != 0 && uVar8 != 0) &&
       (auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar4 / SEXT816((long)cols),0) < (long)uVar8)) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8,src,SUB168(auVar4 % SEXT816((long)cols),0));
      *puVar6 = time;
      __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,cols * uVar8,uVar8,cols);
    uVar7 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    uVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
    ;
  }
  if ((uVar7 == uVar8) && (uVar5 == cols)) {
    pdVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar10 = cols * uVar8;
    uVar8 = lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffe;
    if (1 < lVar10) {
      lVar9 = 0;
      do {
        pdVar1 = pdVar3 + lVar9;
        *(int *)pdVar1 = SUB84(dVar2,0);
        *(undefined4 *)((long)pdVar1 + 4) = uVar11;
        *(int *)(pdVar1 + 1) = SUB84(dVar2,0);
        *(undefined4 *)((long)pdVar1 + 0xc) = uVar11;
        lVar9 = lVar9 + 2;
      } while (lVar9 < (long)uVar8);
    }
    if ((long)uVar8 < lVar10) {
      do {
        pdVar3[uVar8] = dVar2;
        uVar8 = uVar8 + 1;
      } while (lVar10 - uVar8 != 0);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/AssignEvaluator.h"
                ,0x2d1,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}